

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O3

int memCmpRev_fast(void *buf1,void *buf2,size_t count)

{
  byte bVar1;
  byte bVar2;
  
  while( true ) {
    if (count == 0) {
      return 0;
    }
    bVar1 = *(byte *)((long)buf2 + (count - 1));
    bVar2 = *(byte *)((long)buf1 + (count - 1));
    if (bVar1 < bVar2) break;
    count = count - 1;
    if (bVar2 < bVar1) {
      return -1;
    }
  }
  return 1;
}

Assistant:

int FAST(memCmpRev)(const void* buf1, const void* buf2, size_t count)
{
	const octet* b1 = (const octet*)buf1 + count;
	const octet* b2 = (const octet*)buf2 + count;
	ASSERT(memIsValid(buf1, count));
	ASSERT(memIsValid(buf2, count));
	while (count--)
		if (*--b1 > *--b2)
			return 1;
		else if (*b1 < *b2)
			return -1;
	return 0;
}